

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerators::Init(cmQtAutoGenerators *this)

{
  string *psVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _Node *p_Var8;
  _Rb_tree_node_base *p_Var9;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__last;
  cmQtAutoGenerators *this_00;
  char *__end;
  pointer pbVar10;
  iterator iVar11;
  string frameworkPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathComponents;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  frameworkPaths;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedMocIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  incPaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [40];
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  _Rb_tree_node_base *local_90;
  pointer local_88;
  undefined1 local_80 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  psVar1 = &this->OutMocCppFilename;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->TargetName)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)psVar1);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&this->MocCompileDefinitionsStr,&local_48,false);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var7 = (_List_node_base *)(local_a8 + 8);
    pbVar10 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "-D",pbVar10);
      p_Var6 = (_List_node_base *)operator_new(0x30);
      p_Var6[1]._M_next = p_Var6 + 2;
      if (local_b0 == (undefined1  [8])p_Var7) {
        p_Var6[2]._M_next = (_List_node_base *)local_a8._8_8_;
        p_Var6[2]._M_prev = (_List_node_base *)local_a8._16_8_;
      }
      else {
        p_Var6[1]._M_next = (_List_node_base *)local_b0;
        p_Var6[2]._M_next = (_List_node_base *)local_a8._8_8_;
      }
      p_Var6[1]._M_prev = (_List_node_base *)local_a8._0_8_;
      local_a8._0_8_ = (_List_node_base *)0x0;
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_b0 = (undefined1  [8])p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar2 = &(this->MocDefinitions).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      if (local_b0 != (undefined1  [8])p_Var7) {
        operator_delete((void *)local_b0,(ulong)(local_a8._8_8_ + 1));
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmSystemTools::ExpandListArgument(&this->MocOptionsStr,&this->MocOptions,false);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&this->MocIncludesStr,&local_68,false);
  local_a8._16_8_ = local_a8;
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  local_a8._8_8_ = 0;
  local_88 = (pointer)0x0;
  local_90 = (_Rb_tree_node_base *)local_a8._16_8_;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar3 = &local_f8.field_2;
    pbVar10 = local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+(&local_f8,"-I",pbVar10);
      p_Var7 = (_List_node_base *)operator_new(0x30);
      p_Var7[1]._M_next = p_Var7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar3) {
        p_Var7[2]._M_next =
             (_List_node_base *)
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
        p_Var7[2]._M_prev = (_List_node_base *)local_f8.field_2._8_8_;
      }
      else {
        p_Var7[1]._M_next = (_List_node_base *)local_f8._M_dataplus._M_p;
        p_Var7[2]._M_next =
             (_List_node_base *)
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
      }
      p_Var7[1]._M_prev = (_List_node_base *)local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar3;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar2 = &(this->MocIncludes).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      if (0x11 < pbVar10->_M_string_length) {
        iVar5 = strcmp((pbVar10->_M_dataplus)._M_p + (pbVar10->_M_string_length - 0x12),
                       ".framework/Headers");
        if (iVar5 == 0) {
          local_d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_d8._8_8_ = (pointer)0x0;
          local_d8._16_8_ = (pointer)0x0;
          cmsys::SystemTools::SplitPath
                    (pbVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,true);
          cmsys::SystemTools::JoinPath
                    (&local_f8,(const_iterator)local_d8._0_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8._8_8_ + -0x40));
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_b0,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar3) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Rb_tree_node_base *)local_a8._16_8_ != (_Rb_tree_node_base *)local_a8) {
    paVar3 = &local_f8.field_2;
    p_Var9 = (_Rb_tree_node_base *)local_a8._16_8_;
    do {
      local_f8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-F","");
      p_Var7 = (_List_node_base *)operator_new(0x30);
      p_Var7[1]._M_next = p_Var7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar3) {
        p_Var7[2]._M_next =
             (_List_node_base *)
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
        p_Var7[2]._M_prev = (_List_node_base *)local_f8.field_2._8_8_;
      }
      else {
        p_Var7[1]._M_next = (_List_node_base *)local_f8._M_dataplus._M_p;
        p_Var7[2]._M_next =
             (_List_node_base *)
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
      }
      p_Var7[1]._M_prev = (_List_node_base *)local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar3;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar2 = &(this->MocIncludes).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &this->MocIncludes,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var9 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
      psVar2 = &(this->MocIncludes).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)local_a8);
  }
  if (this->IncludeProjectDirsBefore != false) {
    std::operator+(&local_f8,"-I",&this->ProjectBinaryDir);
    this_00 = (cmQtAutoGenerators *)local_d8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,"-I"
                   ,&this->ProjectSourceDir);
    local_80._0_8_ = local_80;
    local_80._16_8_ = 0;
    iVar11._M_node =
         (this->MocIncludes).
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    __last = &this->MocIncludes;
    local_80._8_8_ = local_80._0_8_;
    if (iVar11._M_node != (_List_node_base *)__last) {
      do {
        bVar4 = StartsWith(this_00,(string *)(iVar11._M_node + 1),&local_f8);
        if (bVar4) {
          p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              local_80,(string *)(iVar11._M_node + 1));
          std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
          local_80._16_8_ = local_80._16_8_ + 1;
          p_Var7 = (iVar11._M_node)->_M_next;
          this_00 = (cmQtAutoGenerators *)__last;
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(__last,iVar11);
        }
        else {
          p_Var7 = (iVar11._M_node)->_M_next;
        }
        iVar11._M_node = p_Var7;
      } while (p_Var7 != (_List_node_base *)__last);
    }
    iVar11._M_node =
         (__last->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    if (iVar11._M_node != (_List_node_base *)__last) {
      do {
        bVar4 = StartsWith(this_00,(string *)(iVar11._M_node + 1),(string *)local_d8);
        if (bVar4) {
          p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              local_80,(string *)(iVar11._M_node + 1));
          std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
          local_80._16_8_ = local_80._16_8_ + 1;
          p_Var7 = (iVar11._M_node)->_M_next;
          this_00 = (cmQtAutoGenerators *)__last;
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(__last,iVar11);
        }
        else {
          p_Var7 = (iVar11._M_node)->_M_next;
        }
        iVar11._M_node = p_Var7;
      } while (p_Var7 != (_List_node_base *)__last);
    }
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::_List_iterator<std::__cxx11::string>,void>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_80,
               (const_iterator)local_80,
               (__last->
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next,
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last);
    if ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)__last !=
        (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_80) {
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_dispatch<std::_List_const_iterator<std::__cxx11::string>>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)__last,
                 local_80._0_8_);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmQtAutoGenerators::Init()
{
  this->OutMocCppFilename = this->Builddir;
  this->OutMocCppFilename += this->TargetName;
  this->OutMocCppFilename += ".cpp";

  std::vector<std::string> cdefList;
  cmSystemTools::ExpandListArgument(this->MocCompileDefinitionsStr, cdefList);
  for(std::vector<std::string>::const_iterator it = cdefList.begin();
      it != cdefList.end();
      ++it)
    {
    this->MocDefinitions.push_back("-D" + (*it));
    }

  cmSystemTools::ExpandListArgument(this->MocOptionsStr, this->MocOptions);

  std::vector<std::string> incPaths;
  cmSystemTools::ExpandListArgument(this->MocIncludesStr, incPaths);

  std::set<std::string> frameworkPaths;
  for(std::vector<std::string>::const_iterator it = incPaths.begin();
      it != incPaths.end();
      ++it)
    {
    const std::string &path = *it;
    this->MocIncludes.push_back("-I" + path);
    if (cmHasLiteralSuffix(path, ".framework/Headers"))
      {
      // Go up twice to get to the framework root
      std::vector<std::string> pathComponents;
      cmsys::SystemTools::SplitPath(path, pathComponents);
      std::string frameworkPath =cmsys::SystemTools::JoinPath(
                             pathComponents.begin(), pathComponents.end() - 2);
      frameworkPaths.insert(frameworkPath);
      }
    }

  for (std::set<std::string>::const_iterator it = frameworkPaths.begin();
         it != frameworkPaths.end(); ++it)
    {
    this->MocIncludes.push_back("-F");
    this->MocIncludes.push_back(*it);
    }


    if (this->IncludeProjectDirsBefore)
      {
      const std::string binDir = "-I" + this->ProjectBinaryDir;

      const std::string srcDir = "-I" + this->ProjectSourceDir;

      std::list<std::string> sortedMocIncludes;
      std::list<std::string>::iterator it = this->MocIncludes.begin();
      while (it != this->MocIncludes.end())
        {
        if (this->StartsWith(*it, binDir))
          {
          sortedMocIncludes.push_back(*it);
          it = this->MocIncludes.erase(it);
          }
        else
          {
          ++it;
          }
        }
      it = this->MocIncludes.begin();
      while (it != this->MocIncludes.end())
        {
        if (this->StartsWith(*it, srcDir))
          {
          sortedMocIncludes.push_back(*it);
          it = this->MocIncludes.erase(it);
          }
        else
          {
          ++it;
          }
        }
      sortedMocIncludes.insert(sortedMocIncludes.end(),
                           this->MocIncludes.begin(), this->MocIncludes.end());
      this->MocIncludes = sortedMocIncludes;
    }

}